

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcomplex.c
# Opt level: O0

void z_div(doublecomplex *c,doublecomplex *a,doublecomplex *b)

{
  double dVar1;
  double local_50;
  double ci;
  double cr;
  double abi;
  double abr;
  double den;
  double ratio;
  doublecomplex *b_local;
  doublecomplex *a_local;
  doublecomplex *c_local;
  
  abi = b->r;
  if (abi < 0.0) {
    abi = -abi;
  }
  cr = b->i;
  if (cr < 0.0) {
    cr = -cr;
  }
  if (cr < abi) {
    dVar1 = b->i / b->r;
    local_50 = b->r * (dVar1 * dVar1 + 1.0);
    ci = (a->i * dVar1 + a->r) / local_50;
    local_50 = (-a->r * dVar1 + a->i) / local_50;
  }
  else {
    if ((cr == 0.0) && (!NAN(cr))) {
      fprintf(_stderr,"z_div.c: division by zero\n");
      exit(-1);
    }
    dVar1 = b->r / b->i;
    local_50 = b->i * (dVar1 * dVar1 + 1.0);
    ci = (a->r * dVar1 + a->i) / local_50;
    local_50 = (a->i * dVar1 + -a->r) / local_50;
  }
  c->r = ci;
  c->i = local_50;
  return;
}

Assistant:

void z_div(doublecomplex *c, const doublecomplex *a, const doublecomplex *b)
{
    double ratio, den;
    double abr, abi, cr, ci;
  
    if( (abr = b->r) < 0.)
	abr = - abr;
    if( (abi = b->i) < 0.)
	abi = - abi;
    if( abr <= abi ) {
	if (abi == 0) {
	    fprintf(stderr, "z_div.c: division by zero\n");
            exit(-1);
	}	  
	ratio = b->r / b->i ;
	den = b->i * (1 + ratio*ratio);
	cr = (a->r*ratio + a->i) / den;
	ci = (a->i*ratio - a->r) / den;
    } else {
	ratio = b->i / b->r ;
	den = b->r * (1 + ratio*ratio);
	cr = (a->r + a->i*ratio) / den;
	ci = (a->i - a->r*ratio) / den;
    }
    c->r = cr;
    c->i = ci;
}